

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O1

void __thiscall create::Serial::onData(Serial *this,error_code *e,size_t *size)

{
  ostream *poVar1;
  transfer_all_t local_61;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_58;
  _Bind<void_(create::Serial::*(std::shared_ptr<create::Serial>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_unsigned_long_&)>
  local_50;
  serial_port *local_30;
  mutable_buffers_1 local_28;
  
  if (e->failed_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[create::Serial] ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"serial error - ",0xf);
    (*e->cat_->_vptr_error_category[4])(&local_50,e->cat_,(ulong)(uint)e->val_);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_50._M_f,local_50._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((tuple<std::shared_ptr<create::Serial>,_std::_Placeholder<1>,_std::_Placeholder<2>_> *)
        local_50._M_f != &local_50._M_bound_args) {
      operator_delete((void *)local_50._M_f);
    }
  }
  else {
    if (*size == 1) {
      (*this->_vptr_Serial[1])(this,(ulong)this->byteRead);
    }
    local_28.super_mutable_buffer.data_ = &this->byteRead;
    local_28.super_mutable_buffer.size_ = 1;
    std::__shared_ptr<create::Serial,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<create::Serial,void>
              ((__shared_ptr<create::Serial,(__gnu_cxx::_Lock_policy)2> *)&local_60,
               (__weak_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<create::Serial>);
    local_50._M_f = (offset_in_Serial_to_subr)onData;
    local_50._8_8_ = 0;
    local_50._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<create::Serial>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
    .super__Head_base<0UL,_std::shared_ptr<create::Serial>,_false>._M_head_impl.
    super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_60;
    local_50._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<create::Serial>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
    .super__Head_base<0UL,_std::shared_ptr<create::Serial>,_false>._M_head_impl.
    super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Stack_58;
    local_60 = (element_type *)0x0;
    p_Stack_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_30 = &this->port;
    boost::asio::detail::
    initiate_async_read_buffer_sequence<boost::asio::basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
    ::operator()((initiate_async_read_buffer_sequence<boost::asio::basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                  *)&local_30,&local_50,&local_28,&local_61);
    if (local_50._M_bound_args.
        super__Tuple_impl<0UL,_std::shared_ptr<create::Serial>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
        .super__Head_base<0UL,_std::shared_ptr<create::Serial>,_false>._M_head_impl.
        super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50._M_bound_args.
                 super__Tuple_impl<0UL,_std::shared_ptr<create::Serial>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                 .super__Head_base<0UL,_std::shared_ptr<create::Serial>,_false>._M_head_impl.
                 super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (p_Stack_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_58);
    }
  }
  return;
}

Assistant:

void Serial::onData(const boost::system::error_code& e, const std::size_t& size) {
    if (e) {
      CERR("[create::Serial] ", "serial error - " << e.message());
      return;
    }

    // Should have read exactly one byte
    if (size == 1) {
      processByte(byteRead);
    } // end if (size == 1)

    // Read the next byte
    boost::asio::async_read(port,
                            boost::asio::buffer(&byteRead, 1),
                            std::bind(&Serial::onData,
                                      shared_from_this(),
                                      std::placeholders::_1,
                                      std::placeholders::_2));
  }